

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# darts.h
# Opt level: O2

size_t __thiscall
MeCab::Darts::DoubleArrayImpl<char,unsigned_char,int,unsigned_int,MeCab::Darts::Length<char>>::
commonPrefixSearch<MeCab::Darts::DoubleArrayImpl<char,unsigned_char,int,unsigned_int,MeCab::Darts::Length<char>>::result_pair_type>
          (DoubleArrayImpl<char,unsigned_char,int,unsigned_int,MeCab::Darts::Length<char>> *this,
          key_type *key,result_pair_type *result,size_t result_len,size_t len,size_t node_pos)

{
  uint uVar1;
  uint uVar2;
  long lVar3;
  ulong uVar4;
  size_t sVar5;
  uint *puVar6;
  bool bVar7;
  
  if (len == 0) {
    len = strlen(key);
  }
  lVar3 = *(long *)this;
  puVar6 = (uint *)(lVar3 + node_pos * 8);
  uVar4 = 0;
  sVar5 = 0;
  do {
    uVar1 = *puVar6;
    uVar2 = *(uint *)(lVar3 + (ulong)uVar1 * 8);
    bVar7 = uVar1 == *(uint *)(lVar3 + 4 + (ulong)uVar1 * 8);
    if (len == sVar5) {
      if ((int)uVar2 >= 0 || !bVar7) {
        return uVar4;
      }
      if (uVar4 < result_len) {
        result[uVar4].value = ~uVar2;
        result[uVar4].length = len;
      }
      return uVar4 + 1;
    }
    if ((int)uVar2 < 0 && bVar7) {
      if (uVar4 < result_len) {
        result[uVar4].value = ~uVar2;
        result[uVar4].length = sVar5;
      }
      uVar4 = uVar4 + 1;
    }
    puVar6 = (uint *)(lVar3 + (ulong)((byte)key[sVar5] + uVar1 + 1) * 8);
    sVar5 = sVar5 + 1;
  } while (uVar1 == puVar6[1]);
  return uVar4;
}

Assistant:

size_t commonPrefixSearch(const key_type *key,
                            T* result,
                            size_t result_len,
                            size_t len = 0,
                            size_t node_pos = 0) const {
    if (!len) len = length_func_()(key);

    register array_type_  b   = array_[node_pos].base;
    register size_t     num = 0;
    register array_type_  n;
    register array_u_type_ p;

    for (register size_t i = 0; i < len; ++i) {
      p = b;  // + 0;
      n = array_[p].base;
      if ((array_u_type_) b == array_[p].check && n < 0) {
        // result[num] = -n-1;
        if (num < result_len) set_result(result[num], -n-1, i);
        ++num;
      }

      p = b +(node_u_type_)(key[i]) + 1;
      if ((array_u_type_) b == array_[p].check)
        b = array_[p].base;
      else
        return num;
    }

    p = b;
    n = array_[p].base;

    if ((array_u_type_)b == array_[p].check && n < 0) {
      if (num < result_len) set_result(result[num], -n-1, len);
      ++num;
    }

    return num;
  }